

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
heter_queue(heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this,
           heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           *i_source)

{
  bool bVar1;
  runtime_type<> *i_type;
  void *i_source_00;
  const_iterator local_88;
  const_iterator local_58;
  undefined1 local_38 [8];
  const_iterator source_it;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *i_source_local;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this_local;
  
  this->m_head = (ControlBlock *)0xffef;
  this->m_tail = (ControlBlock *)0xffef;
  source_it.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)i_source;
  cbegin((const_iterator *)local_38,i_source);
  while( true ) {
    cend(&local_58,
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         source_it.m_value.m_pair.m_type.m_feature_table);
    bVar1 = const_iterator::operator!=((const_iterator *)local_38,&local_58);
    const_iterator::~const_iterator(&local_58);
    if (!bVar1) break;
    i_type = const_iterator::complete_type((const_iterator *)local_38);
    i_source_00 = const_iterator::element_ptr((const_iterator *)local_38);
    dyn_push_copy(this,i_type,i_source_00);
    const_iterator::operator++(&local_88,(const_iterator *)local_38,0);
    const_iterator::~const_iterator(&local_88);
  }
  const_iterator::~const_iterator((const_iterator *)local_38);
  return;
}

Assistant:

heter_queue(const heter_queue & i_source)
            : allocator_type(static_cast<const allocator_type &>(i_source)),
              m_head(reinterpret_cast<ControlBlock *>(s_invalid_control_block)),
              m_tail(reinterpret_cast<ControlBlock *>(s_invalid_control_block))
        {
            for (auto source_it = i_source.cbegin(); source_it != i_source.cend(); source_it++)
            {
                dyn_push_copy(source_it.complete_type(), source_it.element_ptr());
            }
        }